

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::number::impl::DecimalQuantity::toPlainString
          (UnicodeString *__return_storage_ptr__,DecimalQuantity *this)

{
  bool bVar1;
  int8_t iVar2;
  int32_t iVar3;
  int local_30;
  int m;
  DecimalQuantity *this_local;
  UnicodeString *sb;
  
  UnicodeString::UnicodeString(__return_storage_ptr__);
  bVar1 = isNegative(this);
  if (bVar1) {
    UnicodeString::append(__return_storage_ptr__,L'-');
  }
  if ((this->precision == 0) || (iVar3 = getMagnitude(this), iVar3 < 0)) {
    UnicodeString::append(__return_storage_ptr__,L'0');
  }
  for (local_30 = getUpperDisplayMagnitude(this); iVar3 = getLowerDisplayMagnitude(this),
      iVar3 <= local_30; local_30 = local_30 + -1) {
    if (local_30 == -1) {
      UnicodeString::append(__return_storage_ptr__,L'.');
    }
    iVar2 = getDigit(this,local_30);
    UnicodeString::append(__return_storage_ptr__,iVar2 + 0x30);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString DecimalQuantity::toPlainString() const {
    U_ASSERT(!isApproximate);
    UnicodeString sb;
    if (isNegative()) {
        sb.append(u'-');
    }
    if (precision == 0 || getMagnitude() < 0) {
        sb.append(u'0');
    }
    for (int m = getUpperDisplayMagnitude(); m >= getLowerDisplayMagnitude(); m--) {
        if (m == -1) { sb.append(u'.'); }
        sb.append(getDigit(m) + u'0');
    }
    return sb;
}